

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRuleTable::DebugRulePrecedence
          (GdlRuleTable *this,GrcManager *pcman,ostream *strmOut,int ipassBidi)

{
  int iVar1;
  ostream *poVar2;
  size_type_conflict sVar3;
  reference ppGVar4;
  int in_ECX;
  ostream *in_RDX;
  long in_RDI;
  size_t ippass;
  ulong local_58;
  string local_40 [8];
  GrcSymbolTableEntry *in_stack_ffffffffffffffc8;
  
  poVar2 = std::operator<<(in_RDX,"\nTABLE: ");
  GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_ffffffffffffffc8);
  poVar2 = std::operator<<(poVar2,local_40);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_40);
  local_58 = 0;
  while( true ) {
    sVar3 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::size
                      ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38));
    if (sVar3 <= local_58) break;
    ppGVar4 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
                        ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),local_58);
    iVar1 = GdlPass::GlobalID(*ppGVar4);
    if (in_ECX + -1 == iVar1) {
      poVar2 = std::operator<<(in_RDX,"\nPASS ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ECX);
      std::operator<<(poVar2,": bidi\n");
    }
    std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
              ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),local_58);
    GdlPass::DebugRulePrecedence((GdlPass *)this,pcman,strmOut);
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void GdlRuleTable::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut, int ipassBidi)
{
	strmOut << "\nTABLE: " << m_psymName->FullName() << "\n";
	for (size_t ippass = 0; ippass < m_vppass.size(); ippass++)
	{
		if (ipassBidi - 1 == m_vppass[ippass]->GlobalID())
			strmOut << "\nPASS " << ipassBidi << ": bidi\n";

		m_vppass[ippass]->DebugRulePrecedence(pcman, strmOut);
	}
}